

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall
QPDFWriter::setOutputFile(QPDFWriter *this,char *description,FILE *file,bool close_file)

{
  size_t *psVar1;
  element_type *peVar2;
  _Node *p_Var3;
  shared_ptr<Pipeline> p;
  undefined1 local_41;
  shared_ptr<Pipeline> local_40;
  Pl_StdioFile *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_28;
  FILE *local_20;
  
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2->filename = description;
  peVar2->file = file;
  peVar2->close_file = close_file;
  local_30 = (Pl_StdioFile *)0x0;
  local_20 = file;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Pl_StdioFile,std::allocator<Pl_StdioFile>,char_const(&)[12],_IO_FILE*&>
            (&_Stack_28,&local_30,(allocator<Pl_StdioFile> *)&local_41,(char (*) [12])"qpdf output",
             &local_20);
  local_40.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_30->super_Pipeline;
  local_40.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_28._M_pi;
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = std::__cxx11::list<std::shared_ptr<Pipeline>,std::allocator<std::shared_ptr<Pipeline>>>::
           _M_create_node<std::shared_ptr<Pipeline>const&>
                     ((list<std::shared_ptr<Pipeline>,std::allocator<std::shared_ptr<Pipeline>>> *)
                      &peVar2->to_delete,&local_40);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  psVar1 = (size_t *)
           ((long)&(peVar2->to_delete).
                   super__List_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar1 = *psVar1 + 1;
  initializePipelineStack
            (this,local_40.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (local_40.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void
QPDFWriter::setOutputFile(char const* description, FILE* file, bool close_file)
{
    m->filename = description;
    m->file = file;
    m->close_file = close_file;
    std::shared_ptr<Pipeline> p = std::make_shared<Pl_StdioFile>("qpdf output", file);
    m->to_delete.push_back(p);
    initializePipelineStack(p.get());
}